

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farchive.cpp
# Opt level: O2

char * __thiscall FArchive::ReadName(FArchive *this)

{
  DWORD DVar1;
  uint start;
  undefined8 in_RAX;
  char *pcVar2;
  BYTE id;
  
  id = (BYTE)((ulong)in_RAX >> 0x38);
  (*this->_vptr_FArchive[(ulong)(this->m_Storing ^ 1) + 2])(this,&id,1);
  if (id == '\x1b') {
    DVar1 = ReadCount(this);
    start = TArray<char,_char>::Reserve(&this->m_NameStorage,DVar1);
    pcVar2 = (this->m_NameStorage).Array + start;
    (*this->_vptr_FArchive[3])(this,pcVar2,(ulong)(DVar1 - 1));
    pcVar2[DVar1 - 1] = '\0';
    AddName(this,start);
  }
  else if (id == '!') {
    pcVar2 = (char *)0x0;
  }
  else if (id == '\x1c') {
    DVar1 = ReadCount(this);
    if ((this->m_Names).Count <= DVar1) {
      I_Error("Name %u has not been read yet\n",(ulong)DVar1);
    }
    pcVar2 = (this->m_NameStorage).Array + (this->m_Names).Array[DVar1].StringStart;
  }
  else {
    pcVar2 = (char *)0x0;
    I_Error("Expected a name but got something else\n");
  }
  return pcVar2;
}

Assistant:

const char *FArchive::ReadName ()
{
	BYTE id;

	operator<< (id);
	if (id == NIL_NAME)
	{
		return NULL;
	}
	else if (id == OLD_NAME)
	{
		DWORD index = ReadCount ();
		if (index >= m_Names.Size())
		{
			I_Error ("Name %u has not been read yet\n", index);
		}
		return &m_NameStorage[m_Names[index].StringStart];
	}
	else if (id == NEW_NAME)
	{
		DWORD index;
		DWORD size = ReadCount ();
		char *str;

		index = (DWORD)m_NameStorage.Reserve (size);
		str = &m_NameStorage[index];
		Read (str, size-1);
		str[size-1] = 0;
		AddName (index);
		return str;
	}
	else
	{
		I_Error ("Expected a name but got something else\n");
		return NULL;
	}
}